

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.cpp
# Opt level: O2

void eastl::RBTreeErase(rbtree_node_base *pNode,rbtree_node_base *pNodeAnchor)

{
  this_type **pptVar1;
  char cVar2;
  rbtree_node_base *prVar3;
  this_type *ptVar4;
  rbtree_node_base *prVar5;
  this_type *ptVar6;
  this_type *ptVar7;
  this_type *ptVar8;
  this_type *ptVar9;
  
  pptVar1 = &pNodeAnchor->mpNodeParent;
  ptVar4 = pNode->mpNodeRight;
  ptVar9 = pNode->mpNodeLeft;
  prVar5 = pNode;
  ptVar7 = ptVar4;
  if (ptVar9 == (this_type *)0x0) {
LAB_00106d57:
    ptVar8 = prVar5->mpNodeParent;
    if (ptVar7 != (this_type *)0x0) goto LAB_00106d63;
    ptVar7 = (this_type *)0x0;
  }
  else {
    if (ptVar4 != (this_type *)0x0) {
      do {
        prVar5 = ptVar7;
        ptVar7 = prVar5->mpNodeLeft;
      } while (prVar5->mpNodeLeft != (this_type *)0x0);
      ptVar7 = prVar5->mpNodeRight;
      if (prVar5 != pNode) {
        ptVar9->mpNodeParent = prVar5;
        prVar5->mpNodeLeft = ptVar9;
        ptVar8 = prVar5;
        if (prVar5 != ptVar4) {
          ptVar8 = prVar5->mpNodeParent;
          if (ptVar7 != (this_type *)0x0) {
            ptVar7->mpNodeParent = ptVar8;
          }
          ptVar8->mpNodeLeft = ptVar7;
          prVar5->mpNodeRight = ptVar4;
          pNode->mpNodeRight->mpNodeParent = prVar5;
        }
        if (*pptVar1 == pNode) {
          *pptVar1 = prVar5;
          ptVar4 = pNode->mpNodeParent;
        }
        else {
          ptVar4 = pNode->mpNodeParent;
          if (ptVar4->mpNodeLeft == pNode) {
            ptVar4->mpNodeLeft = prVar5;
          }
          else {
            ptVar4->mpNodeRight = prVar5;
          }
        }
        prVar5->mpNodeParent = ptVar4;
        cVar2 = prVar5->mColor;
        prVar5->mColor = pNode->mColor;
        pNode->mColor = cVar2;
        goto LAB_00106dec;
      }
      goto LAB_00106d57;
    }
    ptVar8 = pNode->mpNodeParent;
    ptVar7 = ptVar9;
LAB_00106d63:
    ptVar7->mpNodeParent = ptVar8;
  }
  prVar5 = (rbtree_node_base *)pptVar1;
  if (*pptVar1 != pNode) {
    prVar3 = pNode->mpNodeParent;
    prVar5 = (rbtree_node_base *)&prVar3->mpNodeLeft;
    if (prVar3->mpNodeLeft != pNode) {
      prVar5 = prVar3;
    }
  }
  prVar5->mpNodeRight = ptVar7;
  if (pNodeAnchor->mpNodeLeft == pNode) {
    if (pNode->mpNodeRight == (this_type *)0x0) {
      prVar5 = pNode->mpNodeParent;
    }
    else {
      prVar5 = RBTreeGetMinChild(prVar5);
    }
    pNodeAnchor->mpNodeLeft = prVar5;
  }
  if (pNodeAnchor->mpNodeRight == pNode) {
    if (pNode->mpNodeLeft == (this_type *)0x0) {
      prVar5 = pNode->mpNodeParent;
    }
    else {
      prVar5 = RBTreeGetMaxChild(prVar5);
    }
    pNodeAnchor->mpNodeRight = prVar5;
  }
LAB_00106dec:
  if (pNode->mColor == '\x01') {
    ptVar4 = *pptVar1;
    while (prVar5 = ptVar8, ptVar7 != ptVar4) {
      if ((ptVar7 != (this_type *)0x0) && (ptVar7->mColor != '\x01')) goto LAB_00106f41;
      ptVar9 = prVar5->mpNodeLeft;
      if (ptVar7 == ptVar9) {
        ptVar9 = prVar5->mpNodeRight;
        if (ptVar9->mColor == '\0') {
          ptVar9->mColor = '\x01';
          prVar5->mColor = '\0';
          ptVar4 = RBTreeRotateLeft(prVar5,ptVar4);
          *pptVar1 = ptVar4;
          ptVar9 = prVar5->mpNodeRight;
        }
        ptVar8 = ptVar9->mpNodeLeft;
        if ((ptVar8 == (this_type *)0x0) || (ptVar8->mColor == '\x01')) {
          ptVar6 = ptVar9->mpNodeRight;
          if ((ptVar6 == (this_type *)0x0) || (ptVar6->mColor == '\x01')) goto LAB_00106e9d;
LAB_00106efd:
          if (ptVar6->mColor == '\x01') goto LAB_00106f03;
        }
        else {
          ptVar6 = ptVar9->mpNodeRight;
          if (ptVar6 != (this_type *)0x0) goto LAB_00106efd;
LAB_00106f03:
          ptVar8->mColor = '\x01';
          ptVar9->mColor = '\0';
          ptVar4 = RBTreeRotateRight(ptVar9,ptVar4);
          *pptVar1 = ptVar4;
          ptVar9 = prVar5->mpNodeRight;
          ptVar6 = ptVar9->mpNodeRight;
        }
        ptVar9->mColor = prVar5->mColor;
        prVar5->mColor = '\x01';
        if (ptVar6 != (this_type *)0x0) {
          ptVar6->mColor = '\x01';
        }
        prVar5 = RBTreeRotateLeft(prVar5,ptVar4);
LAB_00106f38:
        *pptVar1 = prVar5;
        break;
      }
      if (ptVar9->mColor == '\0') {
        ptVar9->mColor = '\x01';
        prVar5->mColor = '\0';
        ptVar4 = RBTreeRotateRight(prVar5,ptVar4);
        *pptVar1 = ptVar4;
        ptVar9 = prVar5->mpNodeLeft;
      }
      ptVar8 = ptVar9->mpNodeRight;
      if ((ptVar8 != (this_type *)0x0) && (ptVar8->mColor != '\x01')) {
        ptVar6 = ptVar9->mpNodeLeft;
        if (ptVar6 != (this_type *)0x0) goto LAB_00106eb6;
LAB_00106ebc:
        ptVar8->mColor = '\x01';
        ptVar9->mColor = '\0';
        ptVar4 = RBTreeRotateLeft(ptVar9,ptVar4);
        *pptVar1 = ptVar4;
        ptVar9 = prVar5->mpNodeLeft;
        ptVar6 = ptVar9->mpNodeLeft;
LAB_00106ed8:
        ptVar9->mColor = prVar5->mColor;
        prVar5->mColor = '\x01';
        if (ptVar6 != (this_type *)0x0) {
          ptVar6->mColor = '\x01';
        }
        prVar5 = RBTreeRotateRight(prVar5,ptVar4);
        goto LAB_00106f38;
      }
      ptVar6 = ptVar9->mpNodeLeft;
      if ((ptVar6 != (this_type *)0x0) && (ptVar6->mColor != '\x01')) {
LAB_00106eb6:
        if (ptVar6->mColor == '\x01') goto LAB_00106ebc;
        goto LAB_00106ed8;
      }
LAB_00106e9d:
      ptVar9->mColor = '\0';
      ptVar8 = prVar5->mpNodeParent;
      ptVar7 = prVar5;
    }
    if (ptVar7 != (this_type *)0x0) {
LAB_00106f41:
      ptVar7->mColor = '\x01';
    }
  }
  return;
}

Assistant:

EASTL_API void RBTreeErase(rbtree_node_base* pNode, rbtree_node_base* pNodeAnchor)
    {
        rbtree_node_base*& pNodeRootRef      = pNodeAnchor->mpNodeParent;
        rbtree_node_base*& pNodeLeftmostRef  = pNodeAnchor->mpNodeLeft;
        rbtree_node_base*& pNodeRightmostRef = pNodeAnchor->mpNodeRight;
        rbtree_node_base*  pNodeSuccessor    = pNode;
        rbtree_node_base*  pNodeChild        = NULL;
        rbtree_node_base*  pNodeChildParent  = NULL;

        if(pNodeSuccessor->mpNodeLeft == NULL)         // pNode has at most one non-NULL child.
            pNodeChild = pNodeSuccessor->mpNodeRight;  // pNodeChild might be null.
        else if(pNodeSuccessor->mpNodeRight == NULL)   // pNode has exactly one non-NULL child.
            pNodeChild = pNodeSuccessor->mpNodeLeft;   // pNodeChild is not null.
        else 
        {
            // pNode has two non-null children. Set pNodeSuccessor to pNode's successor. pNodeChild might be NULL.
            pNodeSuccessor = pNodeSuccessor->mpNodeRight;

            while(pNodeSuccessor->mpNodeLeft)
                pNodeSuccessor = pNodeSuccessor->mpNodeLeft;

            pNodeChild = pNodeSuccessor->mpNodeRight;
        }

        // Here we remove pNode from the tree and fix up the node pointers appropriately around it.
        if(pNodeSuccessor == pNode) // If pNode was a leaf node (had both NULL children)...
        {
            pNodeChildParent = pNodeSuccessor->mpNodeParent;  // Assign pNodeReplacement's parent.

            if(pNodeChild) 
                pNodeChild->mpNodeParent = pNodeSuccessor->mpNodeParent;

            if(pNode == pNodeRootRef) // If the node being deleted is the root node...
                pNodeRootRef = pNodeChild; // Set the new root node to be the pNodeReplacement.
            else 
            {
                if(pNode == pNode->mpNodeParent->mpNodeLeft) // If pNode is a left node...
                    pNode->mpNodeParent->mpNodeLeft  = pNodeChild;  // Make pNode's replacement node be on the same side.
                else
                    pNode->mpNodeParent->mpNodeRight = pNodeChild;
                // Now pNode is disconnected from the bottom of the tree (recall that in this pathway pNode was determined to be a leaf).
            }

            if(pNode == pNodeLeftmostRef) // If pNode is the tree begin() node...
            {
                // Because pNode is the tree begin(), pNode->mpNodeLeft must be NULL.
                // Here we assign the new begin() (first node).
                if(pNode->mpNodeRight)
                    pNodeLeftmostRef = RBTreeGetMinChild(pNodeChild); 
                else
                    pNodeLeftmostRef = pNode->mpNodeParent; // This  makes (pNodeLeftmostRef == end()) if (pNode == root node)
            }

            if(pNode == pNodeRightmostRef) // If pNode is the tree last (rbegin()) node...
            {
                // Because pNode is the tree rbegin(), pNode->mpNodeRight must be NULL.
                // Here we assign the new rbegin() (last node)
                if(pNode->mpNodeLeft)
                    pNodeRightmostRef = RBTreeGetMaxChild(pNodeChild);
                else // pNodeChild == pNode->mpNodeLeft
                    pNodeRightmostRef = pNode->mpNodeParent; // makes pNodeRightmostRef == &mAnchor if pNode == pNodeRootRef
            }
        }
        else // else (pNodeSuccessor != pNode)
        {
            // Relink pNodeSuccessor in place of pNode. pNodeSuccessor is pNode's successor.
            // We specifically set pNodeSuccessor to be on the right child side of pNode, so fix up the left child side.
            pNode->mpNodeLeft->mpNodeParent = pNodeSuccessor; 
            pNodeSuccessor->mpNodeLeft = pNode->mpNodeLeft;

            if(pNodeSuccessor == pNode->mpNodeRight) // If pNode's successor was at the bottom of the tree... (yes that's effectively what this statement means)
                pNodeChildParent = pNodeSuccessor; // Assign pNodeReplacement's parent.
            else
            {
                pNodeChildParent = pNodeSuccessor->mpNodeParent;

                if(pNodeChild)
                    pNodeChild->mpNodeParent = pNodeChildParent;

                pNodeChildParent->mpNodeLeft = pNodeChild;

                pNodeSuccessor->mpNodeRight = pNode->mpNodeRight;
                pNode->mpNodeRight->mpNodeParent = pNodeSuccessor;
            }

            if(pNode == pNodeRootRef)
                pNodeRootRef = pNodeSuccessor;
            else if(pNode == pNode->mpNodeParent->mpNodeLeft)
                pNode->mpNodeParent->mpNodeLeft = pNodeSuccessor;
            else 
                pNode->mpNodeParent->mpNodeRight = pNodeSuccessor;

            // Now pNode is disconnected from the tree.

            pNodeSuccessor->mpNodeParent = pNode->mpNodeParent;
            eastl::swap(pNodeSuccessor->mColor, pNode->mColor);
        }

        // Here we do tree balancing as per the conventional red-black tree algorithm.
        if(pNode->mColor == kRBTreeColorBlack) 
        { 
            while((pNodeChild != pNodeRootRef) && ((pNodeChild == NULL) || (pNodeChild->mColor == kRBTreeColorBlack)))
            {
                if(pNodeChild == pNodeChildParent->mpNodeLeft) 
                {
                    rbtree_node_base* pNodeTemp = pNodeChildParent->mpNodeRight;

                    if(pNodeTemp->mColor == kRBTreeColorRed) 
                    {
                        pNodeTemp->mColor = kRBTreeColorBlack;
                        pNodeChildParent->mColor = kRBTreeColorRed;
                        pNodeRootRef = RBTreeRotateLeft(pNodeChildParent, pNodeRootRef);
                        pNodeTemp = pNodeChildParent->mpNodeRight;
                    }

                    if(((pNodeTemp->mpNodeLeft  == NULL) || (pNodeTemp->mpNodeLeft->mColor  == kRBTreeColorBlack)) &&
                        ((pNodeTemp->mpNodeRight == NULL) || (pNodeTemp->mpNodeRight->mColor == kRBTreeColorBlack))) 
                    {
                        pNodeTemp->mColor = kRBTreeColorRed;
                        pNodeChild = pNodeChildParent;
                        pNodeChildParent = pNodeChildParent->mpNodeParent;
                    } 
                    else 
                    {
                        if((pNodeTemp->mpNodeRight == NULL) || (pNodeTemp->mpNodeRight->mColor == kRBTreeColorBlack)) 
                        {
                            pNodeTemp->mpNodeLeft->mColor = kRBTreeColorBlack;
                            pNodeTemp->mColor = kRBTreeColorRed;
                            pNodeRootRef = RBTreeRotateRight(pNodeTemp, pNodeRootRef);
                            pNodeTemp = pNodeChildParent->mpNodeRight;
                        }

                        pNodeTemp->mColor = pNodeChildParent->mColor;
                        pNodeChildParent->mColor = kRBTreeColorBlack;

                        if(pNodeTemp->mpNodeRight) 
                            pNodeTemp->mpNodeRight->mColor = kRBTreeColorBlack;

                        pNodeRootRef = RBTreeRotateLeft(pNodeChildParent, pNodeRootRef);
                        break;
                    }
                } 
                else 
                {   
                    // The following is the same as above, with mpNodeRight <-> mpNodeLeft.
                    rbtree_node_base* pNodeTemp = pNodeChildParent->mpNodeLeft;

                    if(pNodeTemp->mColor == kRBTreeColorRed) 
                    {
                        pNodeTemp->mColor        = kRBTreeColorBlack;
                        pNodeChildParent->mColor = kRBTreeColorRed;

                        pNodeRootRef = RBTreeRotateRight(pNodeChildParent, pNodeRootRef);
                        pNodeTemp = pNodeChildParent->mpNodeLeft;
                    }

                    if(((pNodeTemp->mpNodeRight == NULL) || (pNodeTemp->mpNodeRight->mColor == kRBTreeColorBlack)) &&
                        ((pNodeTemp->mpNodeLeft  == NULL) || (pNodeTemp->mpNodeLeft->mColor  == kRBTreeColorBlack))) 
                    {
                        pNodeTemp->mColor = kRBTreeColorRed;
                        pNodeChild       = pNodeChildParent;
                        pNodeChildParent = pNodeChildParent->mpNodeParent;
                    } 
                    else 
                    {
                        if((pNodeTemp->mpNodeLeft == NULL) || (pNodeTemp->mpNodeLeft->mColor == kRBTreeColorBlack)) 
                        {
                            pNodeTemp->mpNodeRight->mColor = kRBTreeColorBlack;
                            pNodeTemp->mColor              = kRBTreeColorRed;

                            pNodeRootRef = RBTreeRotateLeft(pNodeTemp, pNodeRootRef);
                            pNodeTemp = pNodeChildParent->mpNodeLeft;
                        }

                        pNodeTemp->mColor = pNodeChildParent->mColor;
                        pNodeChildParent->mColor = kRBTreeColorBlack;

                        if(pNodeTemp->mpNodeLeft) 
                            pNodeTemp->mpNodeLeft->mColor = kRBTreeColorBlack;

                        pNodeRootRef = RBTreeRotateRight(pNodeChildParent, pNodeRootRef);
                        break;
                    }
                }
            }

            if(pNodeChild)
                pNodeChild->mColor = kRBTreeColorBlack;
        }

    }